

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckComments.cxx
# Opt level: O2

bool __thiscall
kws::Parser::CheckComments
          (Parser *this,char *begin,char *middle,char *end,bool allowEmptyLineBeforeClass,
          bool checkWrongComment,bool checkMissingComment)

{
  string *psVar1;
  char cVar2;
  pointer pcVar3;
  size_type sVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  size_t sVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  pointer ppVar13;
  size_type sVar14;
  undefined3 in_register_00000089;
  ulong uVar15;
  ulong uVar16;
  string word;
  string sub;
  undefined1 local_100 [24];
  string local_e8 [8];
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  string *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_t local_98;
  string local_90;
  string local_70;
  allocator local_50 [32];
  
  if (CONCAT31(in_register_00000089,checkWrongComment) != 0) {
    this->m_TestsDone[0x13] = true;
    std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x13));
    std::__cxx11::string::assign((char *)&this->m_CommentBegin);
    std::__cxx11::string::assign((char *)&this->m_CommentMiddle);
    std::__cxx11::string::assign((char *)&this->m_CommentEnd);
    for (ppVar13 = (this->m_CommentPositions).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVar13 !=
        (this->m_CommentPositions).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppVar13 = ppVar13 + 1) {
      std::__cxx11::string::string((string *)local_100,"",(allocator *)&local_b8);
      uVar11 = ppVar13->first;
      while ((uVar16 = (this->m_Buffer)._M_string_length, uVar11 < uVar16 &&
             (uVar15 = ppVar13->second, uVar11 < uVar15))) {
        for (; (((uVar12 = uVar16, uVar11 < uVar16 &&
                 (cVar2 = (this->m_Buffer)._M_dataplus._M_p[uVar11], uVar12 = uVar11, cVar2 != '\r')
                 ) && (cVar2 != ' ')) && (uVar12 = uVar15, uVar11 < uVar15)); uVar11 = uVar11 + 1) {
        }
        std::__cxx11::string::string((string *)&local_b8,"",local_50);
        bVar7 = 1;
        bVar5 = 0;
        for (; (uVar12 < (this->m_Buffer)._M_string_length &&
               ((bool)(uVar12 < ppVar13->second & bVar7))); uVar12 = uVar12 + 1) {
          uVar11 = (ulong)(byte)(this->m_Buffer)._M_dataplus._M_p[uVar12];
          if ((uVar11 < 0x21) && ((0x100002400U >> (uVar11 & 0x3f) & 1) != 0)) {
            bVar7 = bVar5 ^ 1;
            uVar12 = uVar12 - bVar5;
          }
          else {
            bVar7 = 1;
            std::__cxx11::string::push_back((char)&local_b8);
            bVar5 = 1;
          }
        }
        if ((local_b8._M_string_length != 0) &&
           (bVar6 = std::operator!=(&local_b8,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_100), bVar6)) {
          std::__cxx11::string::_M_assign((string *)local_100);
        }
        std::__cxx11::string::~string((string *)&local_b8);
        uVar11 = uVar12;
      }
      std::__cxx11::string::~string((string *)local_100);
    }
  }
  bVar7 = 1;
  if (checkMissingComment) {
    this->m_TestsDone[0x14] = true;
    std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x14));
    std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x14));
    std::__cxx11::string::string((string *)&local_70,"",(allocator *)local_100);
    sVar8 = GetClassPosition(this,0,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    psVar1 = &this->m_Buffer;
    local_c0 = &this->m_CommentBegin;
    local_c8 = 0;
    while (sVar8 != 0xffffffffffffffff) {
      local_98 = sVar8;
      sVar8 = GetPositionWithComments(this,sVar8);
      std::__cxx11::string::string((string *)&local_b8,"",(allocator *)local_100);
      pcVar3 = (this->m_CommentEnd)._M_dataplus._M_p;
      sVar4 = (this->m_CommentEnd)._M_string_length;
      for (sVar14 = 0; sVar4 != sVar14; sVar14 = sVar14 + 1) {
        if (pcVar3[sVar14] != ' ') {
          std::__cxx11::string::push_back((char)&local_b8);
        }
      }
      uVar11 = std::__cxx11::string::find((string *)psVar1,(ulong)&local_b8);
      uVar16 = uVar11;
      while (uVar15 = uVar11, uVar15 < sVar8) {
        uVar11 = std::__cxx11::string::find((string *)psVar1,(ulong)&local_b8);
        uVar16 = uVar15;
      }
      if (sVar8 < uVar16 || uVar16 == 0xffffffffffffffff) {
        local_e8 = (string  [8])&local_d8;
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_100._0_8_ = GetLineNumber(this,sVar8,false);
        local_100._16_8_ = 0x14;
        local_100._8_8_ = local_100._0_8_;
        std::__cxx11::string::assign((char *)local_e8);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,(value_type *)local_100);
LAB_00143481:
        uVar9 = std::__cxx11::string::~string(local_e8);
        local_c8 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
      }
      else {
        bVar6 = true;
        for (uVar11 = uVar16; sVar8 != uVar11; uVar11 = uVar11 + 1) {
          cVar2 = (psVar1->_M_dataplus)._M_p[uVar11];
          if (cVar2 != '\r') {
            if (cVar2 == '\n') {
              if (!bVar6) {
                if (allowEmptyLineBeforeClass) goto LAB_001435d0;
                local_e8 = (string  [8])&local_d8;
                local_e0 = 0;
                local_d8._M_local_buf[0] = '\0';
                local_100._0_8_ = GetLineNumber(this,sVar8,false);
                local_100._16_8_ = 0x14;
                local_100._8_8_ = local_100._0_8_;
                std::__cxx11::string::assign((char *)local_e8);
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          (&this->m_ErrorList,(value_type *)local_100);
                goto LAB_00143481;
              }
              bVar6 = false;
            }
            else {
              bVar6 = (bool)(cVar2 != ' ' | bVar6);
            }
          }
        }
        uVar11 = std::__cxx11::string::find((string *)psVar1,(ulong)local_c0);
        uVar15 = uVar11;
        while (uVar15 < uVar16) {
          uVar12 = std::__cxx11::string::find((string *)psVar1,(ulong)local_c0);
          uVar11 = uVar15;
          uVar15 = uVar12;
        }
        if (uVar16 != uVar11 && uVar11 != 0xffffffffffffffff) {
          std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
          lVar10 = std::__cxx11::string::find((char *)local_50,0x162931);
          if (lVar10 == -1) {
            local_e8 = (string  [8])&local_d8;
            local_e0 = 0;
            local_d8._M_local_buf[0] = '\0';
            local_100._0_8_ = GetLineNumber(this,sVar8,false);
            local_100._16_8_ = 0x14;
            local_100._8_8_ = local_100._0_8_;
            std::__cxx11::string::assign((char *)local_e8);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&this->m_ErrorList,(value_type *)local_100);
            uVar9 = std::__cxx11::string::~string(local_e8);
            local_c8 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
          }
          std::__cxx11::string::~string((string *)local_50);
        }
      }
LAB_001435d0:
      std::__cxx11::string::string((string *)&local_90,"",(allocator *)local_100);
      sVar8 = GetClassPosition(this,local_98 + 1,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    bVar7 = (byte)local_c8 ^ 1;
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool Parser::CheckComments(const char* begin,const char* middle,const char* end,
                           bool allowEmptyLineBeforeClass,
                           bool checkWrongComment,
                           bool checkMissingComment)
{
  bool hasError = false;
    
  if(checkWrongComment)
    {
    m_TestsDone[WRONGCOMMENT] = true;
    m_TestsDescription[WRONGCOMMENT] = "The comments are misspelled";
    
    // Set the ivars for the indent checking
    m_CommentBegin = begin;
    m_CommentMiddle = middle;
    m_CommentEnd = end;

    // We check if we have duplicate code in the comments
    std::vector<PairType>::const_iterator it = m_CommentPositions.begin();
    while(it != m_CommentPositions.end())
      {
      std::string previousWord = "";
      size_t i = (*it).first;
      while((i<m_Buffer.size()) && i<(*it).second)
        {    
        // we go to the next space
        while((i<m_Buffer.size()) && ((m_Buffer[i] != ' ') && (m_Buffer[i] != '\r') && (m_Buffer[i] != '\r')) && i<(*it).second)
          {
          i++;
          }
        bool inWord = true;
        bool first = false;
        std::string word = "";
        
        while((i<m_Buffer.size()) && i<(*it).second && inWord)
          {
          if(m_Buffer[i] != ' ' && m_Buffer[i] != '\r' && m_Buffer[i] != '\n')
            {
            word += m_Buffer[i];
            inWord = true;
            first = true;
            }
          else // we have a space
            {
            if(first)
              {
              inWord = false;
              i--;
              }
            }
          i++;
          }

          if (!word.empty()) {
            if (word != previousWord) {
              previousWord = word;
            }
          else if(previousWord.size() > 1 && 
               previousWord[0] != '/'
               && previousWord[0]<48 && previousWord[0]>57 // We check if the first word is not a number
               ) // avoid single char and comment
            {
            Error error;
            error.line = this->GetLineNumber(i,false);
            error.line2 = error.line;
            error.number = WRONGCOMMENT;
            error.description = "Duplicate word: ";
            error.description += previousWord;
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }
      it++;
      } // end buffer loop
    }

  if(checkMissingComment)
    {
    // Check if there is a comment before each class
    m_TestsDone[MISSINGCOMMENT] = true;
    m_TestsDescription[MISSINGCOMMENT] = "The class should have previously defined comments starting with \\class";

    if(allowEmptyLineBeforeClass)
      {
      m_TestsDescription[MISSINGCOMMENT] += " (allowing empty line)";
      }
    else
      {
      m_TestsDescription[MISSINGCOMMENT] += " (not allowing empty line)";
      }

   size_t pos = this->GetClassPosition(0);
   while(pos != std::string::npos)
     {
     size_t poswithcom = this->GetPositionWithComments(pos);

     // Find the last comment (remove spaces if any)
     std::string commentEnd = "";
     for (char j : m_CommentEnd) {
       if (j != ' ') {
         commentEnd += j;
       }
     }

     size_t poscom = m_Buffer.find(commentEnd,0);
     size_t poscomtemp = poscom;
     while(poscomtemp!=std::string::npos && poscomtemp<poswithcom)
       {
       poscom = poscomtemp;
       poscomtemp = m_Buffer.find(commentEnd,poscomtemp+1);
       }

     // if we don't have the comment
     if((poscom == std::string::npos) || (poscom > poswithcom))
       {
       Error error;
       error.line = this->GetLineNumber(poswithcom,false);
       error.line2 = error.line;
       error.number = MISSINGCOMMENT;
       error.description = "Comment is missing for the class";
       m_ErrorList.push_back(error);
       hasError = true;
       }
     else
       {
       // We check if we have m_CommentEnd before an empty line
       bool emptyLine = false;
       bool gotchar = true;
       for(size_t i=poscom;i<poswithcom;i++)
         {
         if(m_Buffer[i] == '\n')
           {
           if(!gotchar)
             {
             emptyLine = true;
             break;
             }
           gotchar = false;
           }

         if( (m_Buffer[i] != '\n') 
           && (m_Buffer[i] != '\r') 
           && (m_Buffer[i] != ' '))
           {
           gotchar = true;
           }   
         }

       if(emptyLine)
         {
         if(!allowEmptyLineBeforeClass)
           {
           Error error;
           error.line = this->GetLineNumber(poswithcom,false);
           error.line2 = error.line;
           error.number = MISSINGCOMMENT;
           error.description = "Comment is missing for the class";
           m_ErrorList.push_back(error);
           hasError = true;
           }
         }
       else  // we check that the word \class exists
         {
         // Find the last 
         size_t poscombeg = m_Buffer.find(m_CommentBegin,0);
         size_t poscombegt = poscombeg;
         while(poscombegt!=std::string::npos && poscombegt<poscom)
           {
           poscombeg = poscombegt;
           poscombegt = m_Buffer.find(m_CommentBegin,poscombegt+1);
           }

         if(poscombeg!=std::string::npos && (poscom-poscombeg>0))
           {
           std::string sub = m_Buffer.substr(poscombeg,poscom-poscombeg);
           if(sub.find("\\class") == std::string::npos)
             {
             Error error;
             error.line = this->GetLineNumber(poswithcom,false);
             error.line2 = error.line;
             error.number = MISSINGCOMMENT;
             error.description = "comment doesn't have \\class";
             m_ErrorList.push_back(error);
             hasError = true;
             }
           }
         }
       }
     pos = this->GetClassPosition(pos+1);
     }
   } // end check missing comments
  return !hasError;
}